

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ocsp_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  int iVar1;
  undefined1 local_60 [8];
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((*(ushort *)&hs->config->field_0x10d >> 2 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    contents.u._28_4_ = type;
    iVar1 = CBB_add_u16(out_compressible,5);
    if ((((iVar1 != 0) &&
         (iVar1 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)local_60), iVar1 != 0)) &&
        (iVar1 = CBB_add_u8((CBB *)local_60,'\x01'), iVar1 != 0)) &&
       (((iVar1 = CBB_add_u16((CBB *)local_60,0), iVar1 != 0 &&
         (iVar1 = CBB_add_u16((CBB *)local_60,0), iVar1 != 0)) &&
        (iVar1 = CBB_flush(out_compressible), iVar1 != 0)))) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ocsp_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                     CBB *out_compressible,
                                     ssl_client_hello_type_t type) {
  if (!hs->config->ocsp_stapling_enabled) {
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_status_request) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u8(&contents, TLSEXT_STATUSTYPE_ocsp) ||
      !CBB_add_u16(&contents, 0 /* empty responder ID list */) ||
      !CBB_add_u16(&contents, 0 /* empty request extensions */) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}